

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

Vec_Wrd_t * Abc_SuppGen(int m,int n)

{
  int iVar1;
  Vec_Wrd_t *p;
  undefined4 local_1c;
  int Size;
  int i;
  Vec_Wrd_t *vRes;
  int n_local;
  int m_local;
  
  p = Vec_WrdAlloc(1000);
  for (local_1c = 0; (int)local_1c < 1 << ((byte)n & 0x1f); local_1c = local_1c + 1) {
    iVar1 = Abc_SuppCountOnes(local_1c);
    if (iVar1 == m) {
      Vec_WrdPush(p,(long)(int)local_1c);
    }
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_SuppGen( int m, int n )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i, Size = (1 << n);
    for ( i = 0; i < Size; i++ )
        if ( Abc_SuppCountOnes(i) == m )
            Vec_WrdPush( vRes, i );
    return vRes;
}